

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::ClassId
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> local_221;
  string local_220;
  TPZFileEqnStorage<double> local_200;
  TPZFrontNonSym<double> local_148;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"TPZFrontMatrix",&local_221);
  uVar1 = Hash(&local_220);
  iVar2 = TPZAbstractFrontMatrix<double>::ClassId(&this->super_TPZAbstractFrontMatrix<double>);
  TPZFileEqnStorage<double>::TPZFileEqnStorage(&local_200);
  iVar3 = TPZFileEqnStorage<double>::ClassId(&local_200);
  TPZFrontNonSym<double>::TPZFrontNonSym(&local_148);
  iVar4 = TPZFrontNonSym<double>::ClassId(&local_148);
  TPZFrontNonSym<double>::~TPZFrontNonSym(&local_148);
  TPZFileEqnStorage<double>::~TPZFileEqnStorage(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}